

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void NOPN2_Reset(ym3438_t *chip,Bit32u clock,Bit32u rate)

{
  int iVar1;
  uint local_1c;
  Bit32u i;
  Bit32u rate_local;
  Bit32u clock_local;
  ym3438_t *chip_local;
  
  memset(chip,0,0x8548);
  chip->clock = clock;
  chip->smplRate = rate;
  for (local_1c = 0; local_1c < 0x18; local_1c = local_1c + 1) {
    chip->eg_out[local_1c] = 0x3ff;
    chip->eg_level[local_1c] = 0x3ff;
    chip->eg_state[local_1c] = '\x03';
    chip->multi[local_1c] = '\x01';
  }
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    chip->pan_l[local_1c] = '\x01';
    chip->pan_r[local_1c] = '\x01';
  }
  chip->rateratio = (Bit32s)(((ulong)chip->smplRate * 0x24000) / (ulong)chip->clock);
  iVar1 = chip->rateratio + -0x400;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  if (iVar1 < 2) {
    chip->rateratio = 0x400;
  }
  return;
}

Assistant:

void NOPN2_Reset(ym3438_t *chip, Bit32u clock, Bit32u rate)
{
    Bit32u i;
    memset(chip, 0, sizeof(ym3438_t));
    chip->clock = clock;
    chip->smplRate = rate;
    for (i = 0; i < 24; i++)
    {
        chip->eg_out[i] = 0x3ff;
        chip->eg_level[i] = 0x3ff;
        chip->eg_state[i] = eg_num_release;
        chip->multi[i] = 1;
    }
    for (i = 0; i < 6; i++)
    {
        chip->pan_l[i] = 1;
        chip->pan_r[i] = 1;
    }
    // ratio: sampleRate / (clock / 144) * (1 << resamplerFraction)
    chip->rateratio = (Bit32s)((((Bit64u)144 * chip->smplRate) << RSM_FRAC) / chip->clock);
    if (abs(chip->rateratio - (1 << RSM_FRAC)) <= 1)
        chip->rateratio = (1 << RSM_FRAC);
}